

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O2

size_t FindFreeCells(void *page,size_t number,size_t index)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  
  uVar2 = index >> 3;
  uVar3 = index & 0xfffffffffffffff8;
  sVar6 = 0xffffffffffffffff;
  sVar7 = number;
  do {
    if (0xf < uVar2) {
      return 0xffffffffffffffff;
    }
    uVar4 = (ulong)*(byte *)((long)page + uVar2 + 0x10);
    if (sVar7 < 8) {
      cVar1 = ""[uVar4 + sVar7 * 0x100];
      if ((long)cVar1 != -1) {
        if (sVar7 == number) {
          return (long)cVar1 + uVar3;
        }
        if (cVar1 == '\0') {
          return sVar6;
        }
      }
LAB_00106d00:
      lVar5 = (long)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [uVar4];
      sVar7 = number;
      if (lVar5 != 0) {
        sVar6 = (uVar3 - lVar5) + 8;
        sVar7 = number - lVar5;
      }
    }
    else {
      if (sVar7 == number) goto LAB_00106d00;
      sVar7 = sVar7 - 8;
      if (uVar4 != 0) {
        sVar7 = number;
      }
    }
    if (sVar7 == 0) {
      return sVar6;
    }
    uVar2 = uVar2 + 1;
    uVar3 = uVar3 + 8;
  } while( true );
}

Assistant:

static size_t
FindFreeCells(
    void *page,     /*!< Page to look into. */
    size_t number,  /*!< Number of cells to look for. */
    size_t index)   /*!< First cell to consider. */
{
    size_t i, first = (size_t)-1, remaining;
    char seq;
    unsigned char *mask = PAGE_BITMASK(page);

    /*
     * Iterate over bytes of the bitmask to find a chain of <number> zero bits.
     */

    ASSERT(number <= AVAILABLE_CELLS);
    remaining = number;
    for (i = (index>>3); i < (CELLS_PER_PAGE>>3); i++) {
        if (remaining <= 7) {
            /*
             * End of sequence, or whole sequence for number < 8.
             * Find sequence in byte.
             */

            seq = firstZeroBitSequence[remaining-1][mask[i]];
            if (seq != -1) {
                if (remaining == number) {
                    /*
                     * Sequence fits into one byte.
                     */

                    return (i<<3) + seq;
                }

                /*
                 * Sequence spans over several bytes.
                 */

                if (seq == 0) {
                    /*
                     * Sequence is contiguous.
                     */

                    return first;
                }
            }

            /*
             * Sequence interrupted, restart.
             */

            remaining = number;
        }

        /*
         * Sequence may span over several bytes.
         */

        if (remaining == number) {
            /*
             * Beginning of sequence.
             *
             * @note leading bits actually denote trailing cells: bit 0 (LSB) is
             * first cell, bit 7 (MSB) is last.
             */

            seq = longestLeadingZeroBitSequence[mask[i]];
            if (seq) {
                first = (i<<3) + (8-seq);
                remaining -= seq;
            }
        } else {
            /*
             * Middle of sequence, look for 8 bits cleared = zero byte.
             */

            if (mask[i] == 0) {
                /*
                 * Continue sequence.
                 */

                remaining -= 8;
            } else {
                /*
                 * Sequence interrupted, restart.
                 */

                remaining = number;
            }
        }
        if (remaining == 0) {
            /*
             * End of sequence reached.
             */

            return first;
        }
    }

    /*
     * None found.
     */

    return (size_t)-1;
}